

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

int64 libebml::ReadCodedSizeSignedValue(binary *InBuffer,uint32 *BufferSize,uint64 *SizeUnknown)

{
  uint64 local_28;
  int64 Result;
  uint64 *SizeUnknown_local;
  uint32 *BufferSize_local;
  binary *InBuffer_local;
  
  local_28 = ReadCodedSizeValue(InBuffer,BufferSize,SizeUnknown);
  if (*BufferSize != 0) {
    switch(*BufferSize) {
    case 1:
      local_28 = local_28 - 0x3f;
      break;
    case 2:
      local_28 = local_28 - 0x1fff;
      break;
    case 3:
      local_28 = local_28 - 0xfffff;
      break;
    case 4:
      local_28 = local_28 - 0x7ffffff;
    }
  }
  return local_28;
}

Assistant:

int64 ReadCodedSizeSignedValue(const binary * InBuffer, uint32 & BufferSize, uint64 & SizeUnknown)
{
  int64 Result = ReadCodedSizeValue(InBuffer, BufferSize, SizeUnknown);

  if (BufferSize != 0) {
    switch (BufferSize) {
      case 1:
        Result -= 63;
        break;
      case 2:
        Result -= 8191;
        break;
      case 3:
        Result -= 1048575L;
        break;
      case 4:
        Result -= 134217727L;
        break;
    }
  }

  return Result;
}